

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O0

int line_x2_proc(Am_Object *self)

{
  int iVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Object local_18 [8];
  Am_Object node;
  Am_Object *self_local;
  
  _node = self;
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)self,(ulong)END_NODE);
  Am_Object::Am_Object(local_18,pAVar3);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)local_18,100);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)local_18,0x66);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::~Am_Object(local_18);
  return iVar1 + iVar2 / 2;
}

Assistant:

Am_Define_Formula(int, line_x2)
{
  Am_Object node = self.Get(END_NODE);
  return (int)node.Get(Am_LEFT) + (int)node.Get(Am_WIDTH) / 2;
}